

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QRhiShaderResourceBinding *
QRhiShaderResourceBinding::uniformBuffer(int binding,StageFlags stage,QRhiBuffer *buf)

{
  long lVar1;
  QRhiBuffer *in_RCX;
  Int in_EDX;
  int in_ESI;
  QRhiShaderResourceBinding *in_RDI;
  long in_FS_OFFSET;
  QRhiShaderResourceBinding *b;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0xaa,0x118);
  QRhiShaderResourceBinding((QRhiShaderResourceBinding *)0x691e58);
  (in_RDI->d).binding = in_ESI;
  (in_RDI->d).stage.super_QFlagsStorageHelper<QRhiShaderResourceBinding::StageFlag,_4>.
  super_QFlagsStorage<QRhiShaderResourceBinding::StageFlag>.i = in_EDX;
  (in_RDI->d).type = UniformBuffer;
  (in_RDI->d).u.ubuf.buf = in_RCX;
  (in_RDI->d).u.ubuf.offset = 0;
  (in_RDI->d).u.ubuf.maybeSize = 0;
  (in_RDI->d).u.ubuf.hasDynamicOffset = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QRhiShaderResourceBinding QRhiShaderResourceBinding::uniformBuffer(
        int binding, StageFlags stage, QRhiBuffer *buf)
{
    QRhiShaderResourceBinding b;
    b.d.binding = binding;
    b.d.stage = stage;
    b.d.type = UniformBuffer;
    b.d.u.ubuf.buf = buf;
    b.d.u.ubuf.offset = 0;
    b.d.u.ubuf.maybeSize = 0; // entire buffer
    b.d.u.ubuf.hasDynamicOffset = false;
    return b;
}